

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_ignoreOtherParametersMultipleCalls_Test::
TEST_MockParameterTest_ignoreOtherParametersMultipleCalls_Test
          (TEST_MockParameterTest_ignoreOtherParametersMultipleCalls_Test *this)

{
  TEST_MockParameterTest_ignoreOtherParametersMultipleCalls_Test *this_local;
  
  memset(this,0,8);
  TEST_GROUP_CppUTestGroupMockParameterTest::TEST_GROUP_CppUTestGroupMockParameterTest
            (&this->super_TEST_GROUP_CppUTestGroupMockParameterTest);
  (this->super_TEST_GROUP_CppUTestGroupMockParameterTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_MockParameterTest_ignoreOtherParametersMultipleCalls_Test_00359510;
  return;
}

Assistant:

TEST(MockParameterTest, ignoreOtherParametersMultipleCalls)
{
    mock().expectOneCall("foo").ignoreOtherParameters();
    mock().expectOneCall("foo").ignoreOtherParameters();
    mock().actualCall("foo").withParameter("p2", 2).withParameter("p3", 3).withParameter("p4", 4);
    LONGS_EQUAL(1, mock().expectedCallsLeft());
    mock().actualCall("foo").withParameter("p2", 2).withParameter("p3", 3).withParameter("p4", 4);

    mock().checkExpectations();
}